

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O1

void __thiscall
rigtorp::mpmc::
Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
::emplace<std::unique_ptr<int,std::default_delete<int>>>
          (Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
           *this,unique_ptr<int,_std::default_delete<int>_> *args)

{
  atomic<unsigned_long> *paVar1;
  ulong uVar2;
  Slot<std::unique_ptr<int,_std::default_delete<int>_>_> *pSVar3;
  
  LOCK();
  paVar1 = &this->head_;
  uVar2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  pSVar3 = this->slots_ + uVar2 % this->capacity_;
  do {
  } while ((uVar2 / this->capacity_) * 2 != (pSVar3->turn).super___atomic_base<unsigned_long>._M_i);
  (pSVar3->storage).__align =
       (anon_struct_8_0_00000001_for___align)
       (args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  (args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  (pSVar3->turn).super___atomic_base<unsigned_long>._M_i = (uVar2 / this->capacity_) * 2 + 1;
  return;
}

Assistant:

void emplace(Args &&...args) noexcept {
    static_assert(std::is_nothrow_constructible<T, Args &&...>::value,
                  "T must be nothrow constructible with Args&&...");
    auto const head = head_.fetch_add(1);
    auto &slot = slots_[idx(head)];
    while (turn(head) * 2 != slot.turn.load(std::memory_order_acquire))
      ;
    slot.construct(std::forward<Args>(args)...);
    slot.turn.store(turn(head) * 2 + 1, std::memory_order_release);
  }